

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O3

uint64_t helper_psraw_mips(uint64_t fs,uint64_t ft)

{
  byte bVar1;
  uint uVar2;
  
  uVar2 = (uint)ft & 0x7f;
  bVar1 = 0x1f;
  if (uVar2 < 0x1f) {
    bVar1 = (byte)uVar2;
  }
  return CONCAT44((int)(fs >> 0x20) >> (bVar1 & 0x1f),(int)fs >> (bVar1 & 0x1f));
}

Assistant:

uint64_t helper_psraw(uint64_t fs, uint64_t ft)
{
    LMIValue vs;
    unsigned i;

    ft &= 0x7f;
    if (ft > 31) {
        ft = 31;
    }
    vs.d = fs;
    for (i = 0; i < 2; ++i) {
        vs.sw[i] >>= ft;
    }
    return vs.d;
}